

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

label_t __thiscall re2c::CpgotoTable::max_label(CpgotoTable *this)

{
  bool bVar1;
  uint local_1c;
  uint32_t i;
  CpgotoTable *this_local;
  label_t max;
  
  this_local._4_4_ = label_t::first();
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    bVar1 = label_t::operator<((label_t *)((long)&this_local + 4),&this->table[local_1c]->label);
    if (bVar1) {
      this_local._4_4_ = (this->table[local_1c]->label).value;
    }
  }
  return (label_t)this_local._4_4_;
}

Assistant:

label_t CpgotoTable::max_label () const
{
	label_t max = label_t::first ();
	for (uint32_t i = 0; i < TABLE_SIZE; ++i)
	{
		if (max < table[i]->label)
		{
			max = table[i]->label;
		};
	}
	return max;
}